

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O1

bool __thiscall
trieste::detail::InsideStar<2UL>::match(InsideStar<2UL> *this,NodeIt *it,Node *parent,Match *match)

{
  element_type *peVar1;
  TokenDef *pTVar2;
  TokenDef *pTVar3;
  element_type *peVar4;
  byte bVar5;
  int in_EAX;
  long lVar6;
  bool bVar7;
  
  for (peVar1 = (parent->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      peVar1 != (element_type *)0x0; peVar1 = peVar1->parent_) {
    lVar6 = 0;
    bVar7 = false;
    do {
      pTVar2 = (peVar1->type_).def;
      pTVar3 = *(TokenDef **)((long)&(this->types)._M_elems[0].def + lVar6);
      if (pTVar2 == pTVar3) {
        peVar4 = (this->super_PatternDef).continuation.
                 super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar4 == (element_type *)0x0) {
          in_EAX = 1;
        }
        else {
          in_EAX = (*peVar4->_vptr_PatternDef[4])(peVar4,it,parent,match);
        }
      }
      bVar5 = (byte)in_EAX;
      if (pTVar2 == pTVar3) break;
      lVar6 = lVar6 + 8;
      bVar7 = lVar6 == 0x10;
    } while (!bVar7);
    if (!bVar7) goto LAB_0020605b;
  }
  bVar5 = 0;
LAB_0020605b:
  return (bool)(bVar5 & 1);
}

Assistant:

bool match(NodeIt& it, const Node& parent, Match& match) const& override
      {
        NodeDef* p = &*parent;

        while (p)
        {
          for (const auto& type : types)
            if (p->type() == type)
              return match_continuation(it, parent, match);

          p = p->parent();
        }

        return false;
      }